

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTime.c
# Opt level: O0

float Map_TimeCutComputeArrival(Map_Node_t *pNode,Map_Cut_t *pCut,int fPhase,float tWorstLimit)

{
  float *pfVar1;
  uint uVar2;
  Map_Super_t *pMVar3;
  Map_Time_t *pMVar4;
  Map_Time_t *pMVar5;
  float fVar6;
  float local_68;
  float local_64;
  int local_60;
  int i;
  float tExtra;
  float tDelay;
  int fPinPhase;
  Map_Time_t *ptArrIn;
  Map_Time_t *ptArrRes;
  uint uPhaseTot;
  Map_Super_t *pSuper;
  Map_Match_t *pM;
  float tWorstLimit_local;
  int fPhase_local;
  Map_Cut_t *pCut_local;
  Map_Node_t *pNode_local;
  
  pMVar3 = pCut->M[fPhase].pSuperBest;
  uVar2 = pCut->M[fPhase].uPhaseBest;
  pMVar4 = &pCut->M[fPhase].tArrive;
  if (pNode->p->pNodeDelays == (float *)0x0) {
    local_64 = 0.0;
  }
  else {
    local_64 = pNode->p->pNodeDelays[pNode->Num];
  }
  pCut->M[fPhase].tArrive.Fall = 0.0;
  pMVar4->Rise = 0.0;
  pCut->M[fPhase].tArrive.Worst = 3.4028235e+37;
  local_60 = (int)pCut->nLeaves;
  while( true ) {
    do {
      local_60 = local_60 + -1;
      if (local_60 < 0) {
        pfVar1 = &pCut->M[fPhase].tArrive.Fall;
        if (pMVar4->Rise < *pfVar1 || pMVar4->Rise == *pfVar1) {
          local_68 = pCut->M[fPhase].tArrive.Fall;
        }
        else {
          local_68 = pMVar4->Rise;
        }
        pCut->M[fPhase].tArrive.Worst = local_68;
        return pCut->M[fPhase].tArrive.Worst;
      }
      pMVar5 = pCut->ppLeaves[local_60]->tArrival +
               (int)(uint)((uVar2 & 1 << ((byte)local_60 & 0x1f)) == 0);
      if (0.0 < pMVar3->tDelaysR[local_60].Rise) {
        fVar6 = pMVar5->Rise + pMVar3->tDelaysR[local_60].Rise + local_64;
        if (tWorstLimit < fVar6) {
          return 3.4028235e+37;
        }
        if (pMVar4->Rise < fVar6) {
          pMVar4->Rise = fVar6;
        }
      }
      if (0.0 < pMVar3->tDelaysR[local_60].Fall) {
        fVar6 = pMVar5->Fall + pMVar3->tDelaysR[local_60].Fall + local_64;
        if (tWorstLimit < fVar6) {
          return 3.4028235e+37;
        }
        if (pMVar4->Rise < fVar6) {
          pMVar4->Rise = fVar6;
        }
      }
      if (0.0 < pMVar3->tDelaysF[local_60].Rise) {
        fVar6 = pMVar5->Rise + pMVar3->tDelaysF[local_60].Rise + local_64;
        if (tWorstLimit < fVar6) {
          return 3.4028235e+37;
        }
        if (pCut->M[fPhase].tArrive.Fall < fVar6) {
          pCut->M[fPhase].tArrive.Fall = fVar6;
        }
      }
    } while (pMVar3->tDelaysF[local_60].Fall <= 0.0);
    fVar6 = pMVar5->Fall + pMVar3->tDelaysF[local_60].Fall + local_64;
    if (tWorstLimit < fVar6) break;
    if (pCut->M[fPhase].tArrive.Fall < fVar6) {
      pCut->M[fPhase].tArrive.Fall = fVar6;
    }
  }
  return 3.4028235e+37;
}

Assistant:

float Map_TimeCutComputeArrival( Map_Node_t * pNode, Map_Cut_t * pCut, int fPhase, float tWorstLimit )
{
    Map_Match_t * pM = pCut->M + fPhase;
    Map_Super_t * pSuper = pM->pSuperBest;
    unsigned uPhaseTot = pM->uPhaseBest;
    Map_Time_t * ptArrRes = &pM->tArrive;
    Map_Time_t * ptArrIn;
    int fPinPhase;
    float tDelay, tExtra;
    int i;

    tExtra = pNode->p->pNodeDelays ? pNode->p->pNodeDelays[pNode->Num] : 0;
    ptArrRes->Rise  = ptArrRes->Fall = 0.0;
    ptArrRes->Worst = MAP_FLOAT_LARGE;
    for ( i = pCut->nLeaves - 1; i >= 0; i-- )
    {
        // get the phase of the given pin
        fPinPhase = ((uPhaseTot & (1 << i)) == 0);
        ptArrIn = pCut->ppLeaves[i]->tArrival + fPinPhase;

        // get the rise of the output due to rise of the inputs
        if ( pSuper->tDelaysR[i].Rise > 0 )
        {
            tDelay = ptArrIn->Rise + pSuper->tDelaysR[i].Rise + tExtra;
            if ( tDelay > tWorstLimit )
                return MAP_FLOAT_LARGE;
            if ( ptArrRes->Rise < tDelay )
                ptArrRes->Rise = tDelay;
        }

        // get the rise of the output due to fall of the inputs
        if ( pSuper->tDelaysR[i].Fall > 0 )
        {
            tDelay = ptArrIn->Fall + pSuper->tDelaysR[i].Fall + tExtra;
            if ( tDelay > tWorstLimit )
                return MAP_FLOAT_LARGE;
            if ( ptArrRes->Rise < tDelay )
                ptArrRes->Rise = tDelay;
        }

        // get the fall of the output due to rise of the inputs
        if ( pSuper->tDelaysF[i].Rise > 0 )
        {
            tDelay = ptArrIn->Rise + pSuper->tDelaysF[i].Rise + tExtra;
            if ( tDelay > tWorstLimit )
                return MAP_FLOAT_LARGE;
            if ( ptArrRes->Fall < tDelay )
                ptArrRes->Fall = tDelay;
        }

        // get the fall of the output due to fall of the inputs
        if ( pSuper->tDelaysF[i].Fall > 0 )
        {
            tDelay = ptArrIn->Fall + pSuper->tDelaysF[i].Fall + tExtra;
            if ( tDelay > tWorstLimit )
                return MAP_FLOAT_LARGE;
            if ( ptArrRes->Fall < tDelay )
                ptArrRes->Fall = tDelay;
        }
    }
    // return the worst-case of rise/fall arrival times
    ptArrRes->Worst = MAP_MAX(ptArrRes->Rise, ptArrRes->Fall);
    return ptArrRes->Worst;
}